

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_array_find(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int findIndex)

{
  JSValue JVar1;
  JSValue this_obj;
  JSValue JVar2;
  int iVar3;
  void *pvVar4;
  JSValueUnion JVar5;
  ulong uVar6;
  ulong uVar7;
  JSValueUnion JVar8;
  int64_t iVar9;
  JSValueUnion JVar10;
  ulong uVar11;
  int64_t iVar12;
  ulong uVar13;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue JVar14;
  JSValue v_04;
  JSValue JVar15;
  JSValue JVar16;
  JSValue JVar17;
  JSValueUnion local_c0;
  JSValueUnion local_a0;
  int64_t local_98;
  int64_t len;
  JSValue local_68;
  JSValueUnion local_58;
  int64_t local_50;
  JSValueUnion local_48;
  int64_t local_40;
  
  JVar15 = JS_ToObject(ctx,this_val);
  v_02.tag = JVar15.tag;
  local_c0 = JVar15.u;
  iVar3 = js_get_length64(ctx,&len,JVar15);
  iVar9 = 3;
  iVar12 = iVar9;
  if (iVar3 == 0) {
    JVar14 = *argv;
    iVar3 = check_function(ctx,*argv);
    if (iVar3 == 0) {
      if (argc < 2) {
        local_98 = 3;
        local_a0.float64 = 0.0;
      }
      else {
        local_a0 = (JSValueUnion)argv[1].u.ptr;
        local_98 = argv[1].tag;
      }
      pvVar4 = (void *)len;
      if (len < 1) {
        pvVar4 = (void *)0x0;
      }
      for (JVar10.float64 = 0.0; local_c0 = JVar15.u, JVar2.tag = v_02.tag,
          JVar2.u.ptr = local_c0.ptr, pvVar4 != JVar10.ptr; JVar10.float64 = JVar10.float64 + 1) {
        JVar8.float64 = (double)JVar10.float64;
        if (JVar10.ptr < (void *)0x80000000) {
          JVar8 = JVar10;
        }
        iVar12 = 7;
        if (JVar10.ptr < (void *)0x80000000) {
          iVar12 = 0;
        }
        JVar1.tag = iVar12;
        JVar1.u.float64 = JVar8.float64;
        JVar16.tag = iVar12;
        JVar16.u.float64 = JVar8.float64;
        JVar15 = JS_GetPropertyValue(ctx,JVar15,JVar16);
        iVar9 = JVar15.tag;
        JVar5 = JVar15.u;
        if ((int)JVar15.tag == 6) {
LAB_001546ff:
          uVar6 = (ulong)JVar8.ptr & 0x7fffffff00000000;
          uVar7 = (ulong)JVar5.ptr & 0xffffffff00000000;
          uVar11 = (ulong)JVar8.ptr & 0xffffffff;
          uVar13 = (ulong)JVar5.ptr & 0xffffffff;
          goto LAB_00154727;
        }
        this_obj.tag = local_98;
        this_obj.u.float64 = local_a0.float64;
        local_68 = JVar15;
        local_58 = JVar8;
        local_50 = iVar12;
        local_48 = this_val.u;
        local_40 = this_val.tag;
        JVar16 = JS_Call(ctx,JVar14,this_obj,3,&local_68);
        if ((int)JVar16.tag == 6) goto LAB_001546ff;
        iVar3 = JS_ToBoolFree(ctx,JVar16);
        if (iVar3 != 0) {
          if (findIndex == 0) {
            JVar14.tag = iVar12;
            JVar14.u.float64 = JVar8.float64;
            JS_FreeValue(ctx,JVar14);
            v_04.tag = v_02.tag;
            v_04.u.ptr = local_c0.ptr;
            JS_FreeValue(ctx,v_04);
            JVar8.float64 = JVar5.float64 & 0xffffffff00000000;
          }
          else {
            JS_FreeValue(ctx,JVar15);
            v_03.tag = v_02.tag;
            v_03.u.ptr = local_c0.ptr;
            JS_FreeValue(ctx,v_03);
            JVar8.float64 = JVar8.float64 & 0x7fffffff00000000;
            JVar15 = JVar1;
          }
          goto LAB_00154762;
        }
        JS_FreeValue(ctx,JVar15);
        v.tag = iVar12;
        v.u.float64 = JVar8.float64;
        JS_FreeValue(ctx,v);
        JVar15 = JVar2;
      }
      JS_FreeValue(ctx,JVar15);
      JVar8.float64 = 0.0;
      JVar10.float64 = 2.12199579047121e-314;
      if (findIndex == 0) {
        JVar10.float64 = JVar8.float64;
      }
      JVar15.tag = (ulong)(findIndex == 0) * 3;
      JVar15.u.float64 = JVar10.float64;
      goto LAB_00154762;
    }
    uVar11 = 0;
    uVar6 = 0;
    uVar13 = 0;
    uVar7 = 0;
  }
  else {
    uVar11 = 0;
    uVar6 = 0;
    uVar13 = 0;
    uVar7 = 0;
  }
LAB_00154727:
  v_00.u.ptr = (void *)(uVar11 | uVar6);
  v_00.tag = iVar12;
  JS_FreeValue(ctx,v_00);
  v_01.tag = iVar9;
  v_01.u.ptr = (void *)(uVar13 | uVar7);
  JS_FreeValue(ctx,v_01);
  v_02.u.float64 = local_c0.float64;
  JS_FreeValue(ctx,v_02);
  JVar8.float64 = 0.0;
  JVar15 = (JSValue)(ZEXT816(6) << 0x40);
LAB_00154762:
  JVar17.u.float64 = (ulong)JVar15.u.ptr & 0xffffffff | JVar8.float64;
  JVar17.tag = JVar15.tag;
  return JVar17;
}

Assistant:

static JSValue js_array_find(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv, int findIndex)
{
    JSValueConst func, this_arg;
    JSValueConst args[3];
    JSValue obj, val, index_val, res;
    int64_t len, k;

    index_val = JS_UNDEFINED;
    val = JS_UNDEFINED;
    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    func = argv[0];
    if (check_function(ctx, func))
        goto exception;

    this_arg = JS_UNDEFINED;
    if (argc > 1)
        this_arg = argv[1];

    for(k = 0; k < len; k++) {
        index_val = JS_NewInt64(ctx, k);
        if (JS_IsException(index_val))
            goto exception;
        val = JS_GetPropertyValue(ctx, obj, index_val);
        if (JS_IsException(val))
            goto exception;
        args[0] = val;
        args[1] = index_val;
        args[2] = this_val;
        res = JS_Call(ctx, func, this_arg, 3, args);
        if (JS_IsException(res))
            goto exception;
        if (JS_ToBoolFree(ctx, res)) {
            if (findIndex) {
                JS_FreeValue(ctx, val);
                JS_FreeValue(ctx, obj);
                return index_val;
            } else {
                JS_FreeValue(ctx, index_val);
                JS_FreeValue(ctx, obj);
                return val;
            }
        }
        JS_FreeValue(ctx, val);
        JS_FreeValue(ctx, index_val);
    }
    JS_FreeValue(ctx, obj);
    if (findIndex)
        return JS_NewInt32(ctx, -1);
    else
        return JS_UNDEFINED;

exception:
    JS_FreeValue(ctx, index_val);
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}